

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttload.c
# Opt level: O2

FT_Error tt_face_load_font_dir(TT_Face face,FT_Stream stream)

{
  ulong *puVar1;
  FT_Memory memory;
  FT_UInt32 FVar2;
  FT_UInt32 FVar3;
  FT_UInt32 FVar4;
  FT_Error FVar5;
  TT_Table pTVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  FT_ULong FVar12;
  FT_UShort FVar13;
  ushort uVar14;
  FT_Error local_80;
  FT_Error local_7c;
  ulong local_78;
  int local_70;
  int local_6c;
  SFNT_HeaderRec sfnt;
  long local_50 [2];
  ulong local_40;
  ulong local_38;
  
  memory = stream->memory;
  sfnt.offset = FT_Stream_Pos(stream);
  FVar2 = FT_Stream_ReadULong(stream,&local_80);
  sfnt.format_tag = (FT_ULong)FVar2;
  if (local_80 != 0) {
    return local_80;
  }
  local_80 = FT_Stream_ReadFields(stream,tt_face_load_font_dir::offset_table_fields,&sfnt);
  FVar12 = sfnt.offset;
  if (local_80 != 0) {
    return local_80;
  }
  if (sfnt.format_tag == 0x4f54544f) {
    FVar12 = 0x4f54544f;
    FVar13 = sfnt.num_tables;
    if (sfnt.num_tables == 0) {
      return 2;
    }
  }
  else {
    FVar5 = FT_Stream_Seek(stream,sfnt.offset + 0xc);
    if (FVar5 != 0) {
      return FVar5;
    }
    FVar12 = FVar12 + 0x1c;
    FVar13 = 0;
    local_78 = local_78 & 0xffffffff00000000;
    local_6c = 0;
    local_70 = 0;
    local_7c = 0;
    for (uVar9 = 0; uVar9 < sfnt.num_tables; uVar9 = uVar9 + 1) {
      local_7c = FT_Stream_ReadFields
                           (stream,(FT_Frame_Field *)check_table_dir_table_dir_entry_fields,local_50
                           );
      if (local_7c != 0) {
        sfnt.num_tables = (FT_UShort)uVar9;
        break;
      }
      if ((local_40 <= stream->size) &&
         (((local_38 <= stream->size - local_40 || (local_50[0] == 0x766d7478)) ||
          (local_50[0] == 0x686d7478)))) {
        FVar13 = FVar13 + 1;
        if (local_50[0] == 0x4d455441) {
          local_70 = 1;
        }
        else if (local_50[0] == 0x53494e47) {
          local_6c = 1;
        }
        else if ((local_50[0] == 0x68656164) || (local_50[0] == 0x62686564)) {
          if (local_38 < 0x36) {
            return 0x8e;
          }
          local_7c = FT_Stream_Seek(stream,local_40 + 0xc);
          if (local_7c != 0) {
            return local_7c;
          }
          FT_Stream_ReadULong(stream,&local_7c);
          if (local_7c != 0) {
            return local_7c;
          }
          local_7c = FT_Stream_Seek(stream,FVar12);
          local_78 = CONCAT44(local_78._4_4_,1);
          if (local_7c != 0) {
            return local_7c;
          }
        }
      }
      FVar12 = FVar12 + 0x10;
    }
    if (FVar13 == 0) {
      return 2;
    }
    FVar12 = sfnt.format_tag;
    if (((int)local_78 == 0) && (local_6c == 0 || local_70 == 0)) {
      return 0x8e;
    }
  }
  local_80 = 0;
  face->num_tables = FVar13;
  face->format_tag = FVar12;
  pTVar6 = (TT_Table)ft_mem_qrealloc(memory,0x20,0,(ulong)FVar13,(void *)0x0,&local_80);
  face->dir_tables = pTVar6;
  if (((local_80 == 0) && (local_80 = FT_Stream_Seek(stream,sfnt.offset + 0xc), local_80 == 0)) &&
     (local_80 = FT_Stream_EnterFrame(stream,(ulong)sfnt.num_tables << 4), local_80 == 0)) {
    local_78 = 0;
    for (uVar14 = 0; uVar14 < sfnt.num_tables; uVar14 = uVar14 + 1) {
      FVar2 = FT_Stream_GetULong(stream);
      FVar3 = FT_Stream_GetULong(stream);
      FVar4 = FT_Stream_GetULong(stream);
      uVar11 = (ulong)FVar4;
      FVar4 = FT_Stream_GetULong(stream);
      uVar9 = stream->size - uVar11;
      if (uVar11 <= stream->size) {
        uVar8 = (ulong)FVar2;
        uVar7 = (ulong)FVar4;
        if (uVar9 < uVar7) {
          if ((uVar8 != 0x686d7478) && (FVar2 != 0x766d7478)) goto LAB_00207132;
          uVar7 = (ulong)((uint)uVar9 & 0xfffffffc);
        }
        pTVar6 = face->dir_tables;
        lVar10 = 0;
        do {
          if ((local_78 & 0xffff) * 0x20 + 0x20 == lVar10 + 0x20) {
            uVar9 = local_78 & 0xffff;
            pTVar6[uVar9].Tag = uVar8;
            pTVar6[uVar9].CheckSum = (ulong)FVar3;
            pTVar6[uVar9].Offset = uVar11;
            pTVar6[uVar9].Length = uVar7;
            local_78 = (ulong)((int)local_78 + 1);
            break;
          }
          puVar1 = (ulong *)((long)&pTVar6->Tag + lVar10);
          lVar10 = lVar10 + 0x20;
        } while (*puVar1 != uVar8);
      }
LAB_00207132:
    }
    face->num_tables = (FT_UShort)local_78;
    FT_Stream_ExitFrame(stream);
  }
  return local_80;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_load_font_dir( TT_Face    face,
                         FT_Stream  stream )
  {
    SFNT_HeaderRec  sfnt;
    FT_Error        error;
    FT_Memory       memory = stream->memory;
    FT_UShort       nn, valid_entries = 0;

    static const FT_Frame_Field  offset_table_fields[] =
    {
#undef  FT_STRUCTURE
#define FT_STRUCTURE  SFNT_HeaderRec

      FT_FRAME_START( 8 ),
        FT_FRAME_USHORT( num_tables ),
        FT_FRAME_USHORT( search_range ),
        FT_FRAME_USHORT( entry_selector ),
        FT_FRAME_USHORT( range_shift ),
      FT_FRAME_END
    };


    FT_TRACE2(( "tt_face_load_font_dir: %p\n", (void *)face ));

    /* read the offset table */

    sfnt.offset = FT_STREAM_POS();

    if ( FT_READ_ULONG( sfnt.format_tag )                    ||
         FT_STREAM_READ_FIELDS( offset_table_fields, &sfnt ) )
      goto Exit;

    /* many fonts don't have these fields set correctly */
#if 0
    if ( sfnt.search_range != 1 << ( sfnt.entry_selector + 4 )        ||
         sfnt.search_range + sfnt.range_shift != sfnt.num_tables << 4 )
      return FT_THROW( Unknown_File_Format );
#endif

    /* load the table directory */

    FT_TRACE2(( "-- Number of tables: %10hu\n",   sfnt.num_tables ));
    FT_TRACE2(( "-- Format version:   0x%08lx\n", sfnt.format_tag ));

    if ( sfnt.format_tag != TTAG_OTTO )
    {
      /* check first */
      error = check_table_dir( &sfnt, stream, &valid_entries );
      if ( error )
      {
        FT_TRACE2(( "tt_face_load_font_dir:"
                    " invalid table directory for TrueType\n" ));
        goto Exit;
      }
    }
    else
    {
      valid_entries = sfnt.num_tables;
      if ( !valid_entries )
      {
        FT_TRACE2(( "tt_face_load_font_dir: no valid tables found\n" ));
        error = FT_THROW( Unknown_File_Format );
        goto Exit;
      }
    }

    face->num_tables = valid_entries;
    face->format_tag = sfnt.format_tag;

    if ( FT_QNEW_ARRAY( face->dir_tables, face->num_tables ) )
      goto Exit;

    if ( FT_STREAM_SEEK( sfnt.offset + 12 )      ||
         FT_FRAME_ENTER( sfnt.num_tables * 16L ) )
      goto Exit;

    FT_TRACE2(( "\n" ));
    FT_TRACE2(( "  tag    offset    length   checksum\n" ));
    FT_TRACE2(( "  ----------------------------------\n" ));

    valid_entries = 0;
    for ( nn = 0; nn < sfnt.num_tables; nn++ )
    {
      TT_TableRec  entry;
      FT_UShort    i;
      FT_Bool      duplicate;


      entry.Tag      = FT_GET_TAG4();
      entry.CheckSum = FT_GET_ULONG();
      entry.Offset   = FT_GET_ULONG();
      entry.Length   = FT_GET_ULONG();

      /* ignore invalid tables that can't be sanitized */

      if ( entry.Offset > stream->size )
        continue;
      else if ( entry.Length > stream->size - entry.Offset )
      {
        if ( entry.Tag == TTAG_hmtx ||
             entry.Tag == TTAG_vmtx )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          FT_ULong  old_length = entry.Length;
#endif


          /* make metrics table length a multiple of 4 */
          entry.Length = ( stream->size - entry.Offset ) & ~3U;

          FT_TRACE2(( "  %c%c%c%c  %08lx  %08lx  %08lx"
                      " (sanitized; original length %08lx)",
                      (FT_Char)( entry.Tag >> 24 ),
                      (FT_Char)( entry.Tag >> 16 ),
                      (FT_Char)( entry.Tag >> 8  ),
                      (FT_Char)( entry.Tag       ),
                      entry.Offset,
                      entry.Length,
                      entry.CheckSum,
                      old_length ));
        }
        else
          continue;
      }
#ifdef FT_DEBUG_LEVEL_TRACE
      else
        FT_TRACE2(( "  %c%c%c%c  %08lx  %08lx  %08lx",
                    (FT_Char)( entry.Tag >> 24 ),
                    (FT_Char)( entry.Tag >> 16 ),
                    (FT_Char)( entry.Tag >> 8  ),
                    (FT_Char)( entry.Tag       ),
                    entry.Offset,
                    entry.Length,
                    entry.CheckSum ));
#endif

      /* ignore duplicate tables – the first one wins */
      duplicate = 0;
      for ( i = 0; i < valid_entries; i++ )
      {
        if ( face->dir_tables[i].Tag == entry.Tag )
        {
          duplicate = 1;
          break;
        }
      }
      if ( duplicate )
      {
        FT_TRACE2(( "  (duplicate, ignored)\n" ));
        continue;
      }
      else
      {
        FT_TRACE2(( "\n" ));

        /* we finally have a valid entry */
        face->dir_tables[valid_entries++] = entry;
      }
    }

    /* final adjustment to number of tables */
    face->num_tables = valid_entries;

    FT_FRAME_EXIT();

    FT_TRACE2(( "table directory loaded\n" ));
    FT_TRACE2(( "\n" ));

  Exit:
    return error;
  }